

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O2

int __thiscall
anon_unknown.dwarf_e668::MovieState::streamComponentOpen(MovieState *this,uint stream_index)

{
  int iVar1;
  tuple<AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter> tVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  char *pcVar6;
  uint uVar7;
  AVCodecCtxPtr avctx;
  
  if (((this->mFormatCtx)._M_t.
       super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>._M_t.
       super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>.
       super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl)->nb_streams <= stream_index) {
    return -1;
  }
  tVar2.super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>.
  super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>)
       avcodec_alloc_context3(0);
  uVar7 = 0xffffffff;
  avctx._M_t.super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>._M_t.
  super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>.
  super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl =
       (__uniq_ptr_data<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter,_true,_true>)
       (__uniq_ptr_data<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter,_true,_true>)
       tVar2.super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>.
       super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
  if ((tVar2.super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>.
       super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl !=
       (_Head_base<0UL,_AVCodecContext_*,_false>)0x0) &&
     (iVar1 = avcodec_parameters_to_context
                        (tVar2.
                         super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                         .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl,
                         ((this->mFormatCtx)._M_t.
                          super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>
                          .super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl)->streams
                         [stream_index]->codecpar), iVar1 == 0)) {
    lVar3 = avcodec_find_decoder
                      (*(undefined4 *)
                        ((long)tVar2.
                               super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                               .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl + 0x18))
    ;
    if ((lVar3 == 0) ||
       (iVar1 = avcodec_open2(tVar2.
                              super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                              .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl,lVar3,0),
       iVar1 < 0)) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Unsupported codec: ");
      pcVar6 = (char *)avcodec_get_name(*(undefined4 *)
                                         ((long)tVar2.
                                                super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                                                .super__Head_base<0UL,_AVCodecContext_*,_false>.
                                                _M_head_impl + 0x18));
      poVar5 = std::operator<<(poVar5,pcVar6);
      poVar5 = std::operator<<(poVar5," (0x");
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar5 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar5,
                          *(int *)((long)tVar2.
                                         super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                                         .super__Head_base<0UL,_AVCodecContext_*,_false>.
                                         _M_head_impl + 0x18));
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar5 = std::operator<<(poVar5,")");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    else {
      if (*(int *)((long)tVar2.
                         super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                         .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl + 0xc) == 1) {
        lVar3 = 0x38;
        lVar4 = 0x30;
      }
      else {
        if (*(int *)((long)tVar2.
                           super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                           .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl + 0xc) != 0)
        goto LAB_00107af3;
        lVar3 = 0x288;
        lVar4 = 0x280;
      }
      *(AVStream **)
       ((long)&(this->mIOContext)._M_t.
               super___uniq_ptr_impl<AVIOContext,_(anonymous_namespace)::AVIOContextDeleter>._M_t.
               super__Tuple_impl<0UL,_AVIOContext_*,_(anonymous_namespace)::AVIOContextDeleter>.
               super__Head_base<0UL,_AVIOContext_*,_false>._M_head_impl + lVar4) =
           ((this->mFormatCtx)._M_t.
            super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>._M_t.
            super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>.
            super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl)->streams[stream_index];
      std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator=
                ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                 ((long)&(this->mIOContext)._M_t.
                         super___uniq_ptr_impl<AVIOContext,_(anonymous_namespace)::AVIOContextDeleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_AVIOContext_*,_(anonymous_namespace)::AVIOContextDeleter>
                         .super__Head_base<0UL,_AVIOContext_*,_false>._M_head_impl + lVar3),&avctx);
      uVar7 = stream_index;
    }
  }
LAB_00107af3:
  std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::~unique_ptr(&avctx);
  return uVar7;
}

Assistant:

void operator()(AVFrame *ptr) { av_frame_free(&ptr); }